

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram.c
# Opt level: O3

uint32_t NgramBuilder_add_ngram
                   (NgramBuilder builder,uint32_t *wids,uint32_t order,uint32_t prob,uint32_t bow)

{
  char *pcVar1;
  long lVar2;
  size_t sVar3;
  undefined1 local_438 [4];
  undefined1 auStack_434 [4];
  char encode_buff [1024];
  
  if (order < 0x3f) {
    local_438[0] = (bow != 0) << 6 | (byte)order | 0x80;
    if (order == 0) {
      lVar2 = 1;
    }
    else {
      memcpy(local_438 + 1,wids,(ulong)(order * 4));
      lVar2 = (ulong)(order * 4) + 1;
    }
    *(uint32_t *)(local_438 + lVar2) = prob;
    if (bow == 0) {
      sVar3 = lVar2 + 4;
    }
    else {
      *(uint32_t *)(auStack_434 + lVar2) = bow;
      sVar3 = lVar2 + 8;
    }
    builder->added_gram_nums[order - 1] = builder->added_gram_nums[order - 1] + 1;
    pcVar1 = _NgramBuilder_cp_str(builder,local_438,sVar3);
    sVar3 = builder->added_total_gram_num;
    builder->added_total_gram_num = sVar3 + 1;
    builder->ngram_offsets[sVar3] = pcVar1;
    return 0;
  }
  __assert_fail("order < (1<<6) -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/chenkovsky[P]ngram/ngram.c",
                0x17e,"size_t _encode_gram(const uint32_t *, uint32_t, uint32_t, uint32_t, char *)")
  ;
}

Assistant:

uint32_t NgramBuilder_add_ngram(NgramBuilder builder, const uint32_t* wids, uint32_t order, uint32_t prob, uint32_t bow){
    char encode_buff[1024];//actually is 3 + order*4
    uint32_t len = _encode_gram(wids, order, prob, bow, encode_buff);
    
    assert(len <= 1024);
    builder->added_gram_nums[order-1]++;
    builder->ngram_offsets[builder->added_total_gram_num++] = _NgramBuilder_cp_str(builder, encode_buff, len);
    return 0; 
}